

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O1

void __thiscall QtMWidgets::Slider::paintEvent(Slider *this,QPaintEvent *param_1)

{
  int xRadius;
  long lVar1;
  ColorGroup CVar2;
  long *plVar3;
  QPainter p;
  QRect grh;
  QColor grooveColor;
  QRect gr;
  QRect sh;
  undefined1 auStack_68 [16];
  QRect local_58;
  QColor local_48;
  QRect local_38;
  QRect local_28;
  
  local_28 = SliderPrivate::handleRect((this->d).d);
  local_38 = SliderPrivate::grooveRect((this->d).d);
  local_58 = SliderPrivate::grooveHighlightedRect((this->d).d,&local_28,&local_38);
  QPainter::QPainter((QPainter *)auStack_68,(QPaintDevice *)&this->field_0x10);
  CVar2 = QWidget::palette();
  plVar3 = (long *)QPalette::brush(CVar2,Dark);
  local_48._0_8_ = *(undefined8 *)(*plVar3 + 8);
  local_48._8_8_ = *(undefined8 *)(*plVar3 + 0x10);
  QPainter::setPen((QColor *)auStack_68);
  QBrush::QBrush((QBrush *)(auStack_68 + 8),&local_48,SolidPattern);
  QPainter::setBrush((QBrush *)auStack_68);
  QBrush::~QBrush((QBrush *)(auStack_68 + 8));
  QPainter::drawRects((QRect *)auStack_68,(int)&local_38);
  QPainter::setPen((QColor *)auStack_68);
  QBrush::QBrush((QBrush *)(auStack_68 + 8),&((this->d).d)->highlightColor,SolidPattern);
  QPainter::setBrush((QBrush *)auStack_68);
  QBrush::~QBrush((QBrush *)(auStack_68 + 8));
  QPainter::drawRects((QRect *)auStack_68,(int)&local_58);
  QPainter::setRenderHint((RenderHint)auStack_68,true);
  xRadius = ((this->d).d)->radius;
  CVar2 = QWidget::palette();
  plVar3 = (long *)QPalette::brush(CVar2,Dark);
  lVar1 = *plVar3;
  CVar2 = QWidget::palette();
  plVar3 = (long *)QPalette::brush(CVar2,Dark);
  drawSliderHandle((QPainter *)auStack_68,&local_28,xRadius,xRadius,(QColor *)(lVar1 + 8),
                   (QColor *)(*plVar3 + 8));
  QPainter::~QPainter((QPainter *)auStack_68);
  return;
}

Assistant:

void
Slider::paintEvent( QPaintEvent * )
{
	const QRect sh = d->handleRect();
	const QRect gr = d->grooveRect();
	const QRect grh = d->grooveHighlightedRect( sh, gr );

	QPainter p( this );

	const QColor grooveColor = palette().color( QPalette::Dark );

	p.setPen( grooveColor );
	p.setBrush( grooveColor );

	p.drawRect( gr );

	p.setPen( d->highlightColor );
	p.setBrush( d->highlightColor );

	p.drawRect( grh );

	p.setRenderHint( QPainter::Antialiasing );
	drawSliderHandle( &p, sh, d->radius, d->radius,
		palette().color( QPalette::Shadow ),
		palette().color( QPalette::Base ) );
}